

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_linearsolver.c
# Opt level: O3

SUNErrCode SUNLinSolInitialize(SUNLinearSolver S)

{
  _func_SUNErrCode_SUNLinearSolver *UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = S->ops->initialize;
  if (UNRECOVERED_JUMPTABLE != (_func_SUNErrCode_SUNLinearSolver *)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(S);
    return SVar1;
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolInitialize(SUNLinearSolver S)
{
  SUNErrCode ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(S));
  if (S->ops->initialize) { ier = S->ops->initialize(S); }
  else { ier = SUN_SUCCESS; }
  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(S));
  return (ier);
}